

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaPIllegalAttrErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaBasicItemPtr ownerComp,
               xmlAttrPtr attr)

{
  xmlChar *str1;
  xmlChar *pxVar1;
  undefined4 in_register_00000034;
  xmlNodePtr node;
  xmlChar *strA;
  xmlChar *local_28;
  xmlChar *local_20;
  
  node = (xmlNodePtr)CONCAT44(in_register_00000034,error);
  local_20 = (xmlChar *)0x0;
  local_28 = (xmlChar *)0x0;
  xmlSchemaFormatNodeForError(&local_20,(xmlSchemaAbstractCtxtPtr)ctxt,node->parent);
  str1 = local_20;
  if (node->ns == (xmlNs *)0x0) {
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    pxVar1 = node->ns->href;
  }
  pxVar1 = xmlSchemaFormatQName(&local_28,pxVar1,node->name);
  xmlSchemaErr4((xmlSchemaAbstractCtxtPtr)ctxt,0xbdb,node,"%sThe attribute \'%s\' is not allowed.\n"
                ,str1,pxVar1,(xmlChar *)0x0,(xmlChar *)0x0);
  if (local_20 != (xmlChar *)0x0) {
    (*xmlFree)(local_20);
    local_20 = (xmlChar *)0x0;
  }
  if (local_28 != (xmlChar *)0x0) {
    (*xmlFree)(local_28);
  }
  return;
}

Assistant:

static void
xmlSchemaPIllegalAttrErr(xmlSchemaParserCtxtPtr ctxt,
			 xmlParserErrors error,
			 xmlSchemaBasicItemPtr ownerComp ATTRIBUTE_UNUSED,
			 xmlAttrPtr attr)
{
    xmlChar *strA = NULL, *strB = NULL;

    xmlSchemaFormatNodeForError(&strA, ACTXT_CAST ctxt, attr->parent);
    xmlSchemaErr4(ACTXT_CAST ctxt, error, (xmlNodePtr) attr,
	"%sThe attribute '%s' is not allowed.\n", BAD_CAST strA,
	xmlSchemaFormatQNameNs(&strB, attr->ns, attr->name),
	NULL, NULL);
    FREE_AND_NULL(strA);
    FREE_AND_NULL(strB);
}